

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
wallet::anon_unknown_5::WalletImpl::getAddress
          (WalletImpl *this,CTxDestination *dest,string *name,isminetype *is_mine,
          AddressPurpose *purpose)

{
  long lVar1;
  isminetype iVar2;
  CAddressBookData *pCVar3;
  ulong uVar4;
  _Storage<wallet::AddressPurpose,_true> _Var5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  unique_lock<std::recursive_mutex> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_68);
  pCVar3 = CWallet::FindAddressBookEntry
                     ((this->m_wallet).
                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,dest,
                      false);
  if (pCVar3 != (CAddressBookData *)0x0) {
    if (name != (string *)0x0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      if ((pCVar3->label).
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == true) {
        lVar1 = *(long *)&(pCVar3->label).
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,lVar1,
                   (pCVar3->label).
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_string_length + lVar1);
      }
      else {
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,&local_58
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
    }
    uVar4 = (ulong)is_mine | (ulong)purpose;
    if (uVar4 != 0) {
      iVar2 = CWallet::IsMine((this->m_wallet).
                              super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              ,dest);
      uVar4 = (ulong)iVar2;
    }
    if (is_mine != (isminetype *)0x0) {
      *is_mine = (isminetype)uVar4;
    }
    if (purpose != (AddressPurpose *)0x0) {
      if ((pCVar3->purpose).super__Optional_base<wallet::AddressPurpose,_true,_true>._M_payload.
          super__Optional_payload_base<wallet::AddressPurpose>._M_engaged == false) {
        _Var5._M_value._1_3_ = 0;
        _Var5._M_value._0_1_ = (isminetype)uVar4 == ISMINE_NO;
      }
      else {
        _Var5 = (pCVar3->purpose).super__Optional_base<wallet::AddressPurpose,_true,_true>.
                _M_payload.super__Optional_payload_base<wallet::AddressPurpose>._M_payload;
      }
      *purpose = (AddressPurpose)_Var5;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pCVar3 != (CAddressBookData *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

bool getAddress(const CTxDestination& dest,
        std::string* name,
        isminetype* is_mine,
        AddressPurpose* purpose) override
    {
        LOCK(m_wallet->cs_wallet);
        const auto& entry = m_wallet->FindAddressBookEntry(dest, /*allow_change=*/false);
        if (!entry) return false; // addr not found
        if (name) {
            *name = entry->GetLabel();
        }
        std::optional<isminetype> dest_is_mine;
        if (is_mine || purpose) {
            dest_is_mine = m_wallet->IsMine(dest);
        }
        if (is_mine) {
            *is_mine = *dest_is_mine;
        }
        if (purpose) {
            // In very old wallets, address purpose may not be recorded so we derive it from IsMine
            *purpose = entry->purpose.value_or(*dest_is_mine ? AddressPurpose::RECEIVE : AddressPurpose::SEND);
        }
        return true;
    }